

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Token * __thiscall Lexer::match_name(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  ostream *poVar2;
  lexer_exception *this_00;
  bool local_44a;
  string local_428;
  allocator local_401;
  string local_400 [32];
  Position local_3e0;
  TokenPosition local_3d0;
  Type local_3b4;
  Position local_3b0;
  TokenPosition local_3a0;
  Type local_384;
  Position local_380;
  TokenPosition local_370;
  Type local_354;
  Position local_350;
  TokenPosition local_340;
  Type local_324;
  Position local_320;
  TokenPosition local_310;
  Type local_2f4;
  Position local_2f0;
  TokenPosition local_2e0;
  Type local_2c4;
  Position local_2c0;
  TokenPosition local_2b0;
  Type local_294;
  Position local_290;
  TokenPosition local_280;
  Type local_264;
  Position local_260;
  TokenPosition local_250;
  Type local_234;
  Position local_230;
  TokenPosition local_220;
  Type local_208 [2];
  Position local_200;
  TokenPosition local_1f0;
  Type local_1d8;
  int local_1d4;
  undefined1 local_1d0 [4];
  int length;
  string res;
  stringstream local_1a0 [8];
  stringstream buffer;
  ostream local_190 [376];
  Lexer *local_18;
  Lexer *this_local;
  
  local_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  do {
    std::operator<<(local_190,this->current_);
    res.field_2._M_local_buf[0xb] = '\0';
    consume(this,(bool *)(res.field_2._M_local_buf + 0xb));
    bVar1 = Recognition::is_letter(&this->current_);
    local_44a = true;
    if (!bVar1) {
      local_44a = Recognition::is_digit(&this->current_);
    }
  } while (local_44a != false);
  std::__cxx11::stringstream::str();
  local_1d4 = std::__cxx11::string::length();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1d0,anon_var_dwarf_6e25e + 0x17);
  if (bVar1) {
    local_1d8 = kRead;
    Position::Position(&local_200,&(this->position_).super_Position);
    TokenPosition::TokenPosition(&local_1f0,&local_200,local_1d4);
    Token::Token(__return_storage_ptr__,&local_1d8,&local_1f0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1d0,"write");
    if (bVar1) {
      local_208[0] = kWrite;
      Position::Position(&local_230,&(this->position_).super_Position);
      TokenPosition::TokenPosition(&local_220,&local_230,local_1d4);
      Token::Token(__return_storage_ptr__,local_208,&local_220);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1d0,"while");
      if (bVar1) {
        local_234 = kWhile;
        Position::Position(&local_260,&(this->position_).super_Position);
        TokenPosition::TokenPosition(&local_250,&local_260,local_1d4);
        Token::Token(__return_storage_ptr__,&local_234,&local_250);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1d0,"if");
        if (bVar1) {
          local_264 = kIf;
          Position::Position(&local_290,&(this->position_).super_Position);
          TokenPosition::TokenPosition(&local_280,&local_290,local_1d4);
          Token::Token(__return_storage_ptr__,&local_264,&local_280);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1d0,"else");
          if (bVar1) {
            local_294 = kElse;
            Position::Position(&local_2c0,&(this->position_).super_Position);
            TokenPosition::TokenPosition(&local_2b0,&local_2c0,local_1d4);
            Token::Token(__return_storage_ptr__,&local_294,&local_2b0);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1d0,"int");
            if (bVar1) {
              local_2c4 = kInt;
              Position::Position(&local_2f0,&(this->position_).super_Position);
              TokenPosition::TokenPosition(&local_2e0,&local_2f0,local_1d4);
              Token::Token(__return_storage_ptr__,&local_2c4,&local_2e0);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1d0,"real");
              if (bVar1) {
                local_2f4 = kReal;
                Position::Position(&local_320,&(this->position_).super_Position);
                TokenPosition::TokenPosition(&local_310,&local_320,local_1d4);
                Token::Token(__return_storage_ptr__,&local_2f4,&local_310);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_1d0,anon_var_dwarf_5f947 + 0x29);
                if (bVar1) {
                  local_324 = kVoid;
                  Position::Position(&local_350,&(this->position_).super_Position);
                  TokenPosition::TokenPosition(&local_340,&local_350,local_1d4);
                  Token::Token(__return_storage_ptr__,&local_324,&local_340);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1d0,"func");
                  if (bVar1) {
                    local_354 = kFunc;
                    Position::Position(&local_380,&(this->position_).super_Position);
                    TokenPosition::TokenPosition(&local_370,&local_380,local_1d4);
                    Token::Token(__return_storage_ptr__,&local_354,&local_370);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1d0,"return");
                    if (bVar1) {
                      local_384 = kReturn;
                      Position::Position(&local_3b0,&(this->position_).super_Position);
                      TokenPosition::TokenPosition(&local_3a0,&local_3b0,local_1d4);
                      Token::Token(__return_storage_ptr__,&local_384,&local_3a0);
                    }
                    else {
                      bVar1 = Recognition::is_id((string *)local_1d0);
                      if (!bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_400,"",&local_401);
                        std::__cxx11::stringstream::str((string *)local_1a0);
                        std::__cxx11::string::~string(local_400);
                        std::allocator<char>::~allocator((allocator<char> *)&local_401);
                        poVar2 = std::operator<<(local_190,anon_var_dwarf_326f0);
                        poVar2 = std::operator<<(poVar2,(string *)local_1d0);
                        std::operator<<(poVar2,"\"");
                        this_00 = (lexer_exception *)__cxa_allocate_exception(0x38);
                        std::__cxx11::stringstream::str();
                        lexer_exception::lexer_exception(this_00,&this->position_,&local_428);
                        __cxa_throw(this_00,&lexer_exception::typeinfo,
                                    lexer_exception::~lexer_exception);
                      }
                      local_3b4 = kIdentity;
                      Position::Position(&local_3e0,&(this->position_).super_Position);
                      TokenPosition::TokenPosition(&local_3d0,&local_3e0,local_1d4);
                      Token::Token(__return_storage_ptr__,&local_3b4,(string *)local_1d0,&local_3d0)
                      ;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_208[1] = 1;
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_name() {
    std::stringstream buffer;
    do {
        buffer << current_;
        consume(false);
    } while (Recognition::is_letter(current_) || Recognition::is_digit(current_));

    std::string res = buffer.str();
    int length = (int)res.length();
    if (res == "read") {
        return Token(Token::Type::kRead, TokenPosition(position_, length));
    } else if (res == "write") {
        return Token(Token::Type::kWrite, TokenPosition(position_, length));
    } else if (res == "while") {
        return Token(Token::Type::kWhile, TokenPosition(position_, length));
    } else if (res == "if") {
        return Token(Token::Type::kIf, TokenPosition(position_, length));
    } else if (res == "else") {
        return Token(Token::Type::kElse, TokenPosition(position_, length));
    } else if (res == "int") {
        return Token(Token::Type::kInt, TokenPosition(position_, length));
    } else if (res == "real") {
        return Token(Token::Type::kReal, TokenPosition(position_, length));
    } else if (res == "void") {
        return Token(Token::Type::kVoid, TokenPosition(position_, length));
    } else if (res == "func") {
        return Token(Token::Type::kFunc, TokenPosition(position_, length));
    } else if (res == "return") {
        return Token(Token::Type::kReturn, TokenPosition(position_, length));
    } else if (Recognition::is_id(res)) {
        return Token(Token::Type::kIdentity, res, TokenPosition(position_, length));
    } else {
        buffer.str("");
        buffer << "不正确的标识符: \"" << res << "\"";
        throw lexer_exception(position_, buffer.str());
    }
}